

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_GetCommandLineFlagInfoOrDieDeathTest_FlagDoesNotExist::Run(void)

{
  FlagSaver fs;
  CommandLineFlagInfo local_e0;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineFlagInfoOrDieDeathTest","FlagDoesNotExist");
  g_called_exit = '\0';
  gflags_exitfunc = CalledExit;
  GetCommandLineFlagInfoOrDie(&local_e0,"test_int3210");
  CommandLineFlagInfo::~CommandLineFlagInfo(&local_e0);
  gflags_exitfunc = exit;
  if (g_called_exit != '\0') {
    FlagSaver::~FlagSaver(&fs);
    return;
  }
  fprintf(_stderr,"Function didn\'t die (%s): %s\n",".*: flag test_int3210 does not exist",
          "GetCommandLineFlagInfoOrDie(\"test_int3210\")");
  exit(1);
}

Assistant:

TEST(GetCommandLineFlagInfoOrDieDeathTest, FlagDoesNotExist) {
  EXPECT_DEATH(GetCommandLineFlagInfoOrDie("test_int3210"),
               ".*: flag test_int3210 does not exist");
}